

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompStep(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  xmlChar *pxVar2;
  bool bVar3;
  xmlXPathTypeVal local_2c;
  int op1;
  xmlXPathTypeVal type;
  xmlXPathAxisVal axis;
  xmlXPathTestVal test;
  xmlChar *prefix;
  xmlChar *name;
  xmlXPathParserContextPtr ctxt_local;
  
  while( true ) {
    bVar3 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar3 = true, 10 < *ctxt->cur)))) {
      bVar3 = *ctxt->cur == '\r';
    }
    if (!bVar3) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  name = (xmlChar *)ctxt;
  if ((*ctxt->cur == '.') && (ctxt->cur[1] == '.')) {
    ctxt->cur = ctxt->cur + 2;
    while( true ) {
      bVar3 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar3 = true, 10 < *ctxt->cur)))) {
        bVar3 = *ctxt->cur == '\r';
      }
      if (!bVar3) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,10,1,0,(void *)0x0,(void *)0x0);
  }
  else if (*ctxt->cur == '.') {
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    while( true ) {
      bVar3 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar3 = true, 10 < *ctxt->cur)))) {
        bVar3 = *ctxt->cur == '\r';
      }
      if (!bVar3) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
  }
  else {
    prefix = (xmlChar *)0x0;
    _axis = (xmlChar *)0x0;
    type = NODE_TYPE_NODE;
    op1 = 0;
    local_2c = NODE_TYPE_NODE;
    if (*ctxt->cur == '*') {
      op1 = 4;
    }
    else {
      prefix = xmlXPathParseNCName(ctxt);
      if (prefix == (xmlChar *)0x0) {
        if (**(char **)name == '@') {
          if (**(char **)name != '\0') {
            *(long *)name = *(long *)name + 1;
          }
          op1 = 3;
        }
        else {
          op1 = 4;
        }
      }
      else {
        op1 = xmlXPathIsAxisName(prefix);
        if (op1 == 0) {
          op1 = 4;
        }
        else {
          while( true ) {
            bVar3 = true;
            if ((**(char **)name != ' ') &&
               ((**(byte **)name < 9 || (bVar3 = true, 10 < **(byte **)name)))) {
              bVar3 = **(char **)name == '\r';
            }
            if (!bVar3) break;
            if (**(char **)name != '\0') {
              *(long *)name = *(long *)name + 1;
            }
          }
          if ((**(char **)name == ':') && (*(char *)(*(long *)name + 1) == ':')) {
            *(long *)name = *(long *)name + 2;
            (*xmlFree)(prefix);
            prefix = (xmlChar *)0x0;
          }
          else {
            op1 = 4;
          }
        }
      }
    }
    if (*(int *)(name + 0x10) == 0) {
      prefix = xmlXPathCompNodeTest
                         ((xmlXPathParserContextPtr)name,&type,&local_2c,(xmlChar **)&axis,prefix);
      if (type != NODE_TYPE_NODE) {
        if ((((_axis != (xmlChar *)0x0) && (*(long *)(name + 0x18) != 0)) &&
            ((*(uint *)(*(long *)(name + 0x18) + 0x150) & 1) != 0)) &&
           (pxVar2 = xmlXPathNsLookup(*(xmlXPathContextPtr *)(name + 0x18),_axis),
           pxVar2 == (xmlChar *)0x0)) {
          xmlXPathErr((xmlXPathParserContextPtr)name,0x13);
        }
        iVar1 = *(int *)(*(long *)(name + 0x38) + 0x10);
        *(undefined4 *)(*(long *)(name + 0x38) + 0x10) = 0xffffffff;
        while( true ) {
          bVar3 = true;
          if ((**(char **)name != ' ') &&
             ((**(byte **)name < 9 || (bVar3 = true, 10 < **(byte **)name)))) {
            bVar3 = **(char **)name == '\r';
          }
          if (!bVar3) break;
          if (**(char **)name != '\0') {
            *(long *)name = *(long *)name + 1;
          }
        }
        while (**(char **)name == '[') {
          xmlXPathCompPredicate((xmlXPathParserContextPtr)name,0);
        }
        iVar1 = xmlXPathCompExprAdd((xmlXPathParserContextPtr)name,iVar1,
                                    *(int *)(*(long *)(name + 0x38) + 0x10),XPATH_OP_COLLECT,op1,
                                    type,local_2c,_axis,prefix);
        if (iVar1 == -1) {
          (*xmlFree)(_axis);
          (*xmlFree)(prefix);
        }
      }
    }
    else {
      (*xmlFree)(prefix);
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompStep(xmlXPathParserContextPtr ctxt) {
    SKIP_BLANKS;
    if ((CUR == '.') && (NXT(1) == '.')) {
	SKIP(2);
	SKIP_BLANKS;
	PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_PARENT,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);
    } else if (CUR == '.') {
	NEXT;
	SKIP_BLANKS;
    } else {
	xmlChar *name = NULL;
	xmlChar *prefix = NULL;
	xmlXPathTestVal test = (xmlXPathTestVal) 0;
	xmlXPathAxisVal axis = (xmlXPathAxisVal) 0;
	xmlXPathTypeVal type = (xmlXPathTypeVal) 0;
	int op1;

	if (CUR == '*') {
	    axis = AXIS_CHILD;
	} else {
	    if (name == NULL)
		name = xmlXPathParseNCName(ctxt);
	    if (name != NULL) {
		axis = xmlXPathIsAxisName(name);
		if (axis != 0) {
		    SKIP_BLANKS;
		    if ((CUR == ':') && (NXT(1) == ':')) {
			SKIP(2);
			xmlFree(name);
			name = NULL;
		    } else {
			/* an element name can conflict with an axis one :-\ */
			axis = AXIS_CHILD;
		    }
		} else {
		    axis = AXIS_CHILD;
		}
	    } else if (CUR == '@') {
		NEXT;
		axis = AXIS_ATTRIBUTE;
	    } else {
		axis = AXIS_CHILD;
	    }
	}

        if (ctxt->error != XPATH_EXPRESSION_OK) {
            xmlFree(name);
            return;
        }

	name = xmlXPathCompNodeTest(ctxt, &test, &type, &prefix, name);
	if (test == 0)
	    return;

        if ((prefix != NULL) && (ctxt->context != NULL) &&
	    (ctxt->context->flags & XML_XPATH_CHECKNS)) {
	    if (xmlXPathNsLookup(ctxt->context, prefix) == NULL) {
		xmlXPathErr(ctxt, XPATH_UNDEF_PREFIX_ERROR);
	    }
	}

	op1 = ctxt->comp->last;
	ctxt->comp->last = -1;

	SKIP_BLANKS;
	while (CUR == '[') {
	    xmlXPathCompPredicate(ctxt, 0);
	}

        if (PUSH_FULL_EXPR(XPATH_OP_COLLECT, op1, ctxt->comp->last, axis,
                           test, type, (void *)prefix, (void *)name) == -1) {
            xmlFree(prefix);
            xmlFree(name);
        }
    }
}